

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

void IR::Opnd::DumpAddress(void *address,bool printToConsole,bool skipMaskedAddress)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,printToConsole) != 0) {
    if (DAT_01599198 != '\0') {
      Output::Print(L"0x%012I64X",address);
      return;
    }
    if (!skipMaskedAddress) {
      Output::Print(L"0xXXXXXXXX");
      return;
    }
  }
  return;
}

Assistant:

void
Opnd::DumpAddress(void *address, bool printToConsole, bool skipMaskedAddress)
{
    if (!printToConsole)
    {
        return;
    }

    if (!Js::Configuration::Global.flags.DumpIRAddresses)
    {
        if (skipMaskedAddress)
        {
            return;
        }
        Output::Print(_u("0xXXXXXXXX"));
    }
    else
    {
#ifdef TARGET_64
        Output::Print(_u("0x%012I64X"), address);
#else
        Output::Print(_u("0x%08X"), address);
#endif
    }
}